

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTime.c
# Opt level: O0

void Map_TimeComputeRequiredGlobal(Map_Man_t *p)

{
  float *pfVar1;
  int iVar2;
  uint uVar3;
  float *pfVar4;
  long lVar5;
  bool bVar6;
  float fVar7;
  int local_30;
  float Value;
  int i;
  int fPhase;
  Map_Time_t *ptTimeA;
  Map_Time_t *ptTime;
  int fUseConMan;
  Map_Man_t *p_local;
  
  iVar2 = Scl_ConIsRunning();
  bVar6 = false;
  if (iVar2 != 0) {
    iVar2 = Scl_ConHasOutReqs();
    bVar6 = iVar2 != 0;
  }
  fVar7 = Map_TimeComputeArrivalMax(p);
  p->fRequiredGlo = fVar7;
  if ((p->DelayTarget != -1.0) || (NAN(p->DelayTarget))) {
    if (p->fRequiredGlo <= p->DelayTarget + p->fEpsilon) {
      if (p->fRequiredGlo < p->DelayTarget - p->fEpsilon) {
        if ((p->fMappingMode == 1) && (p->fVerbose != 0)) {
          printf("Relaxing the required times from (%4.2f) to the target (%4.2f).\n",
                 (double)p->fRequiredGlo);
        }
        p->fRequiredGlo = p->DelayTarget;
      }
    }
    else if (p->fMappingMode == 1) {
      printf("Cannot meet the target required times (%4.2f). Continue anyway.\n",
             (double)p->DelayTarget);
    }
  }
  for (local_30 = 0; local_30 < p->vMapObjs->nSize; local_30 = local_30 + 1) {
    p->vMapObjs->pArray[local_30]->tRequired[0].Rise = 3.4028235e+37;
    p->vMapObjs->pArray[local_30]->tRequired[0].Fall = 3.4028235e+37;
    p->vMapObjs->pArray[local_30]->tRequired[0].Worst = 3.4028235e+37;
    p->vMapObjs->pArray[local_30]->tRequired[1].Rise = 3.4028235e+37;
    p->vMapObjs->pArray[local_30]->tRequired[1].Fall = 3.4028235e+37;
    p->vMapObjs->pArray[local_30]->tRequired[1].Worst = 3.4028235e+37;
  }
  for (local_30 = 0; local_30 < p->nOutputs; local_30 = local_30 + 1) {
    uVar3 = (uint)((((ulong)p->pOutputs[local_30] & 1) != 0 ^ 0xffU) & 1);
    pfVar4 = (float *)(((ulong)p->pOutputs[local_30] & 0xfffffffffffffffe) + 0x78 +
                      (long)(int)uVar3 * 0xc);
    lVar5 = ((ulong)p->pOutputs[local_30] & 0xfffffffffffffffe) + 0x60 + (long)(int)uVar3 * 0xc;
    if (bVar6) {
      fVar7 = Scl_ConGetOutReqFloat(local_30);
      if ((fVar7 <= 0.0) || (fVar7 < *(float *)(lVar5 + 8))) {
        if ((fVar7 <= 0.0) || (*(float *)(lVar5 + 8) <= fVar7)) {
          fVar7 = p->fRequiredGlo;
          pfVar4[2] = fVar7;
          pfVar4[1] = fVar7;
          *pfVar4 = fVar7;
        }
        else {
          fVar7 = *(float *)(lVar5 + 8);
          pfVar4[2] = fVar7;
          pfVar4[1] = fVar7;
          *pfVar4 = fVar7;
        }
      }
      else {
        pfVar4[2] = fVar7;
        pfVar4[1] = fVar7;
        *pfVar4 = fVar7;
      }
    }
    else if (((p->pOutputRequireds == (Map_Time_t *)0x0) ||
             (p->pOutputRequireds[local_30].Worst <= 0.0)) ||
            (p->pOutputRequireds[local_30].Worst < *(float *)(lVar5 + 8))) {
      if (((p->pOutputRequireds == (Map_Time_t *)0x0) ||
          (p->pOutputRequireds[local_30].Worst <= 0.0)) ||
         (pfVar1 = &p->pOutputRequireds[local_30].Worst,
         *(float *)(lVar5 + 8) < *pfVar1 || *(float *)(lVar5 + 8) == *pfVar1)) {
        fVar7 = p->fRequiredGlo;
        pfVar4[2] = fVar7;
        pfVar4[1] = fVar7;
        *pfVar4 = fVar7;
      }
      else {
        fVar7 = *(float *)(lVar5 + 8);
        pfVar4[2] = fVar7;
        pfVar4[1] = fVar7;
        *pfVar4 = fVar7;
      }
    }
    else {
      fVar7 = p->pOutputRequireds[local_30].Worst;
      pfVar4[2] = fVar7;
      pfVar4[1] = fVar7;
      *pfVar4 = fVar7;
    }
  }
  Map_TimePropagateRequired(p);
  return;
}

Assistant:

void Map_TimeComputeRequiredGlobal( Map_Man_t * p )
{
    int fUseConMan = Scl_ConIsRunning() && Scl_ConHasOutReqs();
    Map_Time_t * ptTime, * ptTimeA;
    int fPhase, i; 
    // update the required times according to the target
    p->fRequiredGlo = Map_TimeComputeArrivalMax( p );
    if ( p->DelayTarget != -1 )
    {
        if ( p->fRequiredGlo > p->DelayTarget + p->fEpsilon )
        {
            if ( p->fMappingMode == 1 )
                printf( "Cannot meet the target required times (%4.2f). Continue anyway.\n", p->DelayTarget );
        }
        else if ( p->fRequiredGlo < p->DelayTarget - p->fEpsilon )
        {
            if ( p->fMappingMode == 1 && p->fVerbose )
                printf( "Relaxing the required times from (%4.2f) to the target (%4.2f).\n", p->fRequiredGlo, p->DelayTarget );
            p->fRequiredGlo = p->DelayTarget;
        }
    }
    // clean the required times
    for ( i = 0; i < p->vMapObjs->nSize; i++ )
    {
        p->vMapObjs->pArray[i]->tRequired[0].Rise  = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[0].Fall  = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[0].Worst = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[1].Rise  = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[1].Fall  = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[1].Worst = MAP_FLOAT_LARGE;
    }
    // set the required times for the POs
    for ( i = 0; i < p->nOutputs; i++ )
    {
        fPhase  = !Map_IsComplement(p->pOutputs[i]);
        ptTime  =  Map_Regular(p->pOutputs[i])->tRequired + fPhase;
        ptTimeA =  Map_Regular(p->pOutputs[i])->tArrival + fPhase;

        if ( fUseConMan )
        {
            float Value = Scl_ConGetOutReqFloat(i);
            // if external required time can be achieved, use it
            if ( Value > 0 && ptTimeA->Worst <= Value )//&& Value <= p->fRequiredGlo )
                ptTime->Rise = ptTime->Fall = ptTime->Worst = Value;
            // if external required cannot be achieved, set the earliest possible arrival time
            else if ( Value > 0 && ptTimeA->Worst > Value )
                ptTime->Rise = ptTime->Fall = ptTime->Worst = ptTimeA->Worst;
            // otherwise, set the global required time
            else
                ptTime->Rise = ptTime->Fall = ptTime->Worst = p->fRequiredGlo;
        }
        else
        {
            // if external required time can be achieved, use it
            if ( p->pOutputRequireds && p->pOutputRequireds[i].Worst > 0 && ptTimeA->Worst <= p->pOutputRequireds[i].Worst )//&& p->pOutputRequireds[i].Worst <= p->fRequiredGlo )
                ptTime->Rise = ptTime->Fall = ptTime->Worst = p->pOutputRequireds[i].Worst;
            // if external required cannot be achieved, set the earliest possible arrival time
            else if ( p->pOutputRequireds && p->pOutputRequireds[i].Worst > 0 && ptTimeA->Worst > p->pOutputRequireds[i].Worst )
                ptTime->Rise = ptTime->Fall = ptTime->Worst = ptTimeA->Worst;
            // otherwise, set the global required time
            else
                ptTime->Rise = ptTime->Fall = ptTime->Worst = p->fRequiredGlo;
        }
    }
    // visit nodes in the reverse topological order
    Map_TimePropagateRequired( p );
}